

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::end_value_with_numeric_check
          (basic_csv_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  char cVar1;
  byte bVar2;
  pointer pcVar3;
  size_type sVar4;
  int iVar5;
  char cVar6;
  size_type sVar7;
  int64_t val;
  size_type local_60;
  pointer local_58;
  string buffer;
  
  pcVar3 = (this->buffer_)._M_dataplus._M_p;
  sVar4 = (this->buffer_)._M_string_length;
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  sVar7 = 0;
  iVar5 = 0;
  do {
    if (iVar5 == 0xb) {
LAB_0026856b:
      local_58 = (this->buffer_)._M_dataplus._M_p;
      local_60 = (this->buffer_)._M_string_length;
      (*visitor->_vptr_basic_json_visitor[0xc])(visitor,&local_60,0,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      std::__cxx11::string::~string((string *)&buffer);
      return;
    }
    if (sVar4 == sVar7) {
      if (iVar5 - 1U < 10) {
        (*(code *)(&DAT_006839fc + *(int *)(&DAT_006839fc + (ulong)(iVar5 - 1U) * 4)))();
        return;
      }
      goto LAB_0026856b;
    }
    cVar6 = (char)&buffer;
    switch(iVar5) {
    case 0:
      cVar1 = pcVar3[sVar7];
      switch(cVar1) {
      case '-':
        std::__cxx11::string::push_back(cVar6);
        iVar5 = 4;
        break;
      case '.':
      case '/':
      case ':':
      case ';':
      case '<':
      case '=':
      case '>':
      case '?':
      case '@':
      case 'A':
      case 'B':
      case 'C':
      case 'D':
      case 'E':
        goto switchD_0026828c_caseD_2e;
      case '0':
switchD_0026828c_caseD_30:
        std::__cxx11::string::push_back(cVar6);
        iVar5 = 5;
        break;
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
switchD_0026828c_caseD_31:
        std::__cxx11::string::push_back(cVar6);
        iVar5 = 6;
        break;
      case 'F':
switchD_0026828c_caseD_46:
        if ((((sVar4 - 5 != sVar7) || ((byte)(pcVar3[sVar7 + 1] | 0x20U) != 0x61)) ||
            ((byte)(pcVar3[sVar7 + 2] | 0x20U) != 0x6c)) ||
           (((byte)(pcVar3[sVar7 + 3] | 0x20U) != 0x73 ||
            ((byte)(pcVar3[sVar7 + 4] | 0x20U) != 0x65)))) goto switchD_0026828c_caseD_2e;
        iVar5 = 3;
        break;
      default:
        if (cVar1 == 'N') {
LAB_002683e8:
          if ((((sVar4 - 4 != sVar7) || ((byte)(pcVar3[sVar7 + 1] | 0x20U) != 0x75)) ||
              ((byte)(pcVar3[sVar7 + 2] | 0x20U) != 0x6c)) ||
             ((byte)(pcVar3[sVar7 + 3] | 0x20U) != 0x6c)) goto switchD_0026828c_caseD_2e;
          iVar5 = 1;
        }
        else {
          if (cVar1 != 'T') {
            if (cVar1 == 'f') goto switchD_0026828c_caseD_46;
            if (cVar1 != 't') {
              if (cVar1 != 'n') goto switchD_0026828c_caseD_2e;
              goto LAB_002683e8;
            }
          }
          if (((sVar4 - 4 != sVar7) || ((byte)(pcVar3[sVar7 + 1] | 0x20U) != 0x72)) ||
             (((byte)(pcVar3[sVar7 + 2] | 0x20U) != 0x75 ||
              ((pcVar3[sVar7 + 3] != 'U' && (pcVar3[sVar7 + 3] != 'e'))))))
          goto switchD_0026828c_caseD_2e;
          iVar5 = 2;
        }
      }
      break;
    case 4:
      if ((byte)pcVar3[sVar7] - 0x31 < 9) goto switchD_0026828c_caseD_31;
      if (pcVar3[sVar7] == 0x30) goto switchD_0026828c_caseD_30;
      goto switchD_0026828c_caseD_2e;
    case 5:
      cVar1 = pcVar3[sVar7];
      if (cVar1 == '.') {
LAB_00268443:
        std::__cxx11::string::push_back(cVar6);
        iVar5 = 7;
      }
      else {
        if ((cVar1 != 'E') && (cVar1 != 'e')) goto switchD_0026828c_caseD_2e;
LAB_0026845a:
        std::__cxx11::string::push_back(cVar6);
        iVar5 = 9;
      }
      break;
    case 6:
      bVar2 = pcVar3[sVar7];
      if (bVar2 - 0x30 < 10) goto switchD_0026828c_caseD_31;
      if ((bVar2 == 0x65) || (bVar2 == 0x45)) goto LAB_0026845a;
      if (bVar2 == 0x2e) goto LAB_00268443;
      goto switchD_0026828c_caseD_2e;
    case 7:
      if (9 < (byte)(pcVar3[sVar7] - 0x30U)) goto switchD_0026828c_caseD_2e;
LAB_002683ac:
      std::__cxx11::string::push_back(cVar6);
      iVar5 = 8;
      break;
    case 8:
      bVar2 = pcVar3[sVar7];
      if (bVar2 - 0x30 < 10) goto LAB_002683ac;
      if ((bVar2 == 0x45) || (bVar2 == 0x65)) goto LAB_0026845a;
      goto switchD_0026828c_caseD_2e;
    case 9:
      bVar2 = pcVar3[sVar7];
      if (bVar2 - 0x30 < 10) {
LAB_0026833b:
        std::__cxx11::string::push_back(cVar6);
        iVar5 = 10;
      }
      else {
        if (bVar2 != 0x2b) {
          if (bVar2 == 0x2d) goto LAB_0026845a;
          goto switchD_0026828c_caseD_2e;
        }
        iVar5 = 9;
      }
      break;
    case 10:
      if ((byte)(pcVar3[sVar7] - 0x30U) < 10) goto LAB_0026833b;
switchD_0026828c_caseD_2e:
      iVar5 = 0xb;
    }
    sVar7 = sVar7 + 1;
  } while( true );
}

Assistant:

void end_value_with_numeric_check(basic_json_visitor<CharT>& visitor, 
        std::error_code& ec)
    {
        numeric_check_state state = numeric_check_state::initial;
        bool is_negative = false;
        //int precision = 0;
        //uint8_t decimal_places = 0;

        auto last = buffer_.end();

        std::string buffer;
        for (auto p = buffer_.begin(); state != numeric_check_state::not_a_number && p != last; ++p)
        {
            switch (state)
            {
                case numeric_check_state::initial:
                {
                    switch (*p)
                    {
                    case 'n':case 'N':
                        if ((last-p) == 4 && (p[1] == 'u' || p[1] == 'U') && (p[2] == 'l' || p[2] == 'L') && (p[3] == 'l' || p[3] == 'L'))
                        {
                            state = numeric_check_state::null;
                        }
                        else
                        {
                            state = numeric_check_state::not_a_number;
                        }
                        break;
                    case 't':case 'T':
                        if ((last-p) == 4 && (p[1] == 'r' || p[1] == 'R') && (p[2] == 'u' || p[2] == 'U') && (p[3] == 'e' || p[3] == 'U'))
                        {
                            state = numeric_check_state::boolean_true;
                        }
                        else
                        {
                            state = numeric_check_state::not_a_number;
                        }
                        break;
                    case 'f':case 'F':
                        if ((last-p) == 5 && (p[1] == 'a' || p[1] == 'A') && (p[2] == 'l' || p[2] == 'L') && (p[3] == 's' || p[3] == 'S') && (p[4] == 'e' || p[4] == 'E'))
                        {
                            state = numeric_check_state::boolean_false;
                        }
                        else
                        {
                            state = numeric_check_state::not_a_number;
                        }
                        break;
                    case '-':
                        is_negative = true;
                        buffer.push_back(*p);
                        state = numeric_check_state::minus;
                        break;
                    case '0':
                        //++precision;
                        buffer.push_back(*p);
                        state = numeric_check_state::zero;
                        break;
                    case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        buffer.push_back(*p);
                        state = numeric_check_state::integer;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::zero:
                {
                    switch (*p)
                    {
                    case '.':
                        buffer.push_back(to_double_.get_decimal_point());
                        state = numeric_check_state::fraction1;
                        break;
                    case 'e':case 'E':
                        buffer.push_back(*p);
                        state = numeric_check_state::exp1;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::integer:
                {
                    switch (*p)
                    {
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        buffer.push_back(*p);
                        break;
                    case '.':
                        buffer.push_back(to_double_.get_decimal_point());
                        state = numeric_check_state::fraction1;
                        break;
                    case 'e':case 'E':
                        buffer.push_back(*p);
                        state = numeric_check_state::exp1;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::minus:
                {
                    switch (*p)
                    {
                    case '0':
                        //++precision;
                        buffer.push_back(*p);
                        state = numeric_check_state::zero;
                        break;
                    case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        buffer.push_back(*p);
                        state = numeric_check_state::integer;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::fraction1:
                {
                    switch (*p)
                    {
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        //++decimal_places;
                        buffer.push_back(*p);
                        state = numeric_check_state::fraction;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::fraction:
                {
                    switch (*p)
                    {
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        //++decimal_places;
                        buffer.push_back(*p);
                        break;
                    case 'e':case 'E':
                        buffer.push_back(*p);
                        state = numeric_check_state::exp1;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::exp1:
                {
                    switch (*p)
                    {
                    case '-':
                        buffer.push_back(*p);
                        break;
                    case '+':
                        break;
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        state = numeric_check_state::exp;
                        buffer.push_back(*p);
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::exp:
                {
                    switch (*p)
                    {
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        buffer.push_back(*p);
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                default:
                    break;
            }
        }

        switch (state)
        {
            case numeric_check_state::null:
                visitor.null_value(semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            case numeric_check_state::boolean_true:
                visitor.bool_value(true, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            case numeric_check_state::boolean_false:
                visitor.bool_value(false, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            case numeric_check_state::zero:
            case numeric_check_state::integer:
            {
                if (is_negative)
                {
                    int64_t val{ 0 };
                    auto result = jsoncons::detail::dec_to_integer(buffer_.data(), buffer_.length(), val);
                    if (result)
                    {
                        visitor.int64_value(val, semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                    }
                    else // Must be overflow
                    {
                        visitor.string_value(buffer_, semantic_tag::bigint, *this, ec);
                        more_ = !cursor_mode_;
                    }
                }
                else
                {
                    uint64_t val{ 0 };
                    auto result = jsoncons::detail::dec_to_integer(buffer_.data(), buffer_.length(), val);
                    if (result)
                    {
                        visitor.uint64_value(val, semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                    }
                    else if (result.ec == jsoncons::detail::to_integer_errc::overflow)
                    {
                        visitor.string_value(buffer_, semantic_tag::bigint, *this, ec);
                        more_ = !cursor_mode_;
                    }
                    else
                    {
                        ec = result.ec;
                        more_ = false;
                        return;
                    }
                }
                break;
            }
            case numeric_check_state::fraction:
            case numeric_check_state::exp:
            {
                if (lossless_number_)
                {
                    visitor.string_value(buffer_,semantic_tag::bigdec, *this, ec);
                    more_ = !cursor_mode_;
                }
                else
                {
                    double d = to_double_(buffer.c_str(), buffer.length());
                    visitor.double_value(d, semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                }
                break;
            }
            default:
            {
                visitor.string_value(buffer_, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
        }
    }